

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffgcprll(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
            int writemode,double *scale,double *zero,char *tform,long *twidth,int *tcode,
            int *maxelem,LONGLONG *startpos,LONGLONG *elemnum,long *incre,LONGLONG *repeat,
            LONGLONG *rowlen,int *hdutype,LONGLONG *tnull,char *snull,int *status)

{
  tcolumn *ptVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  FITSfile *pFVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  long nrows;
  LONGLONG lrepeat;
  LONGLONG heapoffset;
  int tstatus;
  long local_a0;
  tcolumn *local_98;
  LONGLONG local_90;
  char message [81];
  
  uVar3 = (ulong)(uint)colnum;
  tstatus = 0;
  pFVar8 = fptr->Fptr;
  if (fptr->HDUposition == pFVar8->curhdu) {
    if (pFVar8->datastart == -1) {
      iVar7 = ffrdef(fptr,status);
      if (0 < iVar7) goto LAB_0013a343;
    }
    else if (writemode != 0xf && 0 < writemode) {
      if (STREAM_DRIVER - 0x29U < 0xffffffd8) {
        urltype2driver("stream://",&STREAM_DRIVER);
        pFVar8 = fptr->Fptr;
      }
      if (pFVar8->driver == STREAM_DRIVER) {
        lVar11 = pFVar8->datastart + -0xb40;
        if (lVar11 < pFVar8->headend) {
          lVar11 = pFVar8->headend;
        }
        if (pFVar8->ENDpos != lVar11) {
          ffwend(fptr,status);
        }
      }
    }
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar8 = fptr->Fptr;
  iVar7 = pFVar8->hdutype;
  if (firstrow < 1) {
    if (iVar7 == 0) {
      pcVar12 = "Image group number is less than 1: %.0f";
    }
    else {
      pcVar12 = "Starting row number is less than 1: %.0f";
    }
    snprintf(message,0x51,pcVar12,(double)firstrow);
    goto LAB_0013a36e;
  }
  if (firstelem < 1 && iVar7 != 1) {
    pcVar12 = "Starting element number less than 1: %ld";
LAB_0013a272:
    snprintf(message,0x51,pcVar12,firstelem);
LAB_0013a279:
    ffpmsg(message);
    *status = 0x134;
    iVar7 = 0x134;
  }
  else {
    if (nelem < 0) {
      snprintf(message,0x51,"Tried to read or write less than 0 elements: %.0f",(double)nelem);
      ffpmsg(message);
      *status = 0x132;
      return 0x132;
    }
    if ((colnum < 1) || (pFVar8->tfield < colnum)) {
      snprintf(message,0x51,"Specified column number is out of range: %d",uVar3);
      ffpmsg(message);
      snprintf(message,0x51,"  There are %d columns in this table.",(ulong)(uint)fptr->Fptr->tfield)
      ;
      ffpmsg(message);
      *status = 0x12e;
      return 0x12e;
    }
    *hdutype = iVar7;
    *rowlen = pFVar8->rowlength;
    lVar11 = pFVar8->datastart;
    ptVar1 = pFVar8->tableptr;
    *scale = ptVar1[uVar3 - 1].tscale;
    *zero = ptVar1[uVar3 - 1].tzero;
    *tnull = ptVar1[uVar3 - 1].tnull;
    local_90 = ptVar1[uVar3 - 1].tbcol;
    lVar9 = ptVar1[uVar3 - 1].twidth;
    *twidth = lVar9;
    *incre = lVar9;
    *tcode = ptVar1[uVar3 - 1].tdatatype;
    *repeat = ptVar1[uVar3 - 1].trepeat;
    strcpy(tform,ptVar1[uVar3 - 1].tform);
    local_a0 = uVar3 * 0xa0;
    local_98 = ptVar1;
    strcpy(snull,ptVar1[uVar3 - 1].strnull);
    ptVar1 = local_98;
    lVar9 = local_a0;
    if ((*hdutype == 1) && (*snull == '\0')) {
      builtin_strncpy(snull,"                 ",0x12);
      lVar13 = 0x11;
      if (*twidth < 0x12) {
        lVar13 = (long)(int)*twidth;
      }
      snull[lVar13] = '\0';
    }
    uVar10 = *tcode;
    if (writemode - 0xfU < 4) {
      if (((uVar10 + 0x10 & 0xffffffdf) == 0) && (*hdutype != 1)) {
        *incre = 1;
        if ((int)uVar10 < 0) {
          *repeat = *twidth;
        }
        *twidth = 1;
        *scale = 1.0;
        *zero = 0.0;
        *tnull = 0x4995cdd1;
        *maxelem = 0x7080;
        uVar10 = 0xb;
        if (*tcode < 0) {
          uVar10 = 0xfffffff5;
        }
        *tcode = uVar10;
      }
      writemode = writemode + -0x10;
    }
    iVar7 = 0;
    if (writemode != -1) {
      iVar7 = writemode;
    }
    if ((uVar10 + 1 & 0xfffffffd) == 0) {
      uVar10 = uVar10 * 0xb;
      *tcode = uVar10;
      *repeat = (*repeat + 7) / 8;
    }
    iVar6 = *hdutype;
    uVar5 = uVar10;
    if (iVar6 == 2) {
      if (uVar10 == 0xfffffff0) {
        *incre = 1;
        *twidth = nelem;
        uVar5 = 0xfffffff0;
      }
      else if (uVar10 == 0x10) {
        uVar5 = 0x10;
        if (*twidth == 0) {
          *repeat = 0;
        }
        else {
          *repeat = *repeat / *twidth;
        }
      }
    }
    lVar13 = 0;
    if (iVar6 != 1) {
      lVar13 = firstelem + -1;
    }
    *elemnum = lVar13;
    uVar4 = -uVar5;
    if (0 < (int)uVar5) {
      uVar4 = uVar5;
    }
    if (0x52 < uVar4) {
      if ((int)uVar5 < 1) {
        uVar10 = -(1 - uVar5 >> 1);
      }
      else {
        uVar10 = uVar5 + 1 >> 1;
      }
      *tcode = uVar10;
      *repeat = *repeat << 1;
      *twidth = *twidth / 2;
      *incre = *incre / 2;
    }
    uVar5 = -uVar10;
    if (0 < (int)uVar10) {
      uVar5 = uVar10;
    }
    if (uVar5 == 0x10) {
      lVar13 = *twidth;
      if (lVar13 == 0) {
        iVar6 = 0x707f;
        goto LAB_0013a762;
      }
      auVar2 = (ZEXT816(0) << 0x40 | ZEXT816(0x707f)) / SEXT816(lVar13);
      *maxelem = auVar2._0_4_;
      if (auVar2._0_8_ == 0) {
        snprintf(message,0x51,"ASCII string column is too wide: %ld; max supported width is %d",
                 lVar13,0x707f);
        ffpmsg(message);
        *status = 0xec;
        return 0xec;
      }
    }
    else {
      if (uVar5 == 0x2a) {
        iVar6 = 0x1c20;
      }
      else if (uVar5 == 0x52) {
        iVar6 = 0xe10;
      }
      else {
        iVar6 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x7080)) / SEXT816(*twidth),0);
      }
LAB_0013a762:
      *maxelem = iVar6;
    }
    *startpos = local_90 + lVar11 + (firstrow + -1) * *rowlen;
    if (iVar7 == 0 || *hdutype != 0) {
      if (0 < *tcode) {
        lVar11 = *elemnum;
        if (lVar11 < *repeat) {
          lVar9 = (nelem + lVar11 + -1) / *repeat + firstrow;
          pFVar8 = fptr->Fptr;
          lVar11 = pFVar8->numrows;
          if (iVar7 == 0) {
            if ((writemode != -1) && (lVar11 < lVar9)) {
              if (*hdutype == 0) {
                if (lVar11 < firstrow) {
                  snprintf(message,0x51,"Attempted to read from group %ld of the HDU,",firstrow);
                  ffpmsg(message);
                  snprintf(message,0x51,"however the HDU only contains %ld group(s).",
                           fptr->Fptr->numrows);
                }
                else {
                  ffpmsg("Attempt to read past end of array:");
                  snprintf(message,0x51,"  Image has  %ld elements;",*repeat);
                  ffpmsg(message);
                  snprintf(message,0x51,"  Tried to read %ld elements starting at element %ld.",
                           nelem,firstelem);
                }
              }
              else {
                ffpmsg("Attempt to read past end of table:");
                snprintf(message,0x51,"  Table has %.0f rows with %.0f elements per row;",
                         (double)fptr->Fptr->numrows,(double)*repeat);
                ffpmsg(message);
                snprintf(message,0x51,
                         "  Tried to read %.0f elements starting at row %.0f, element %.0f.",
                         (double)nelem,(double)firstrow,(double)(*elemnum + 1));
              }
              goto LAB_0013a36e;
            }
          }
          else if ((nelem != 0) && (lVar13 = lVar9 - lVar11, lVar13 != 0 && lVar11 <= lVar9)) {
            if ((pFVar8->lasthdu == 0) || (0 < pFVar8->heapsize)) {
              iVar6 = ffirow(fptr,lVar11,lVar13,status);
              if (0 < iVar6) {
                snprintf(message,0x51,"Failed to add space for %.0f new rows in table.",
                         (double)lVar13);
                ffpmsg(message);
LAB_0013a343:
                return *status;
              }
            }
            else {
              pFVar8->heapstart = pFVar8->heapstart + lVar13 * pFVar8->rowlength;
              pFVar8->numrows = lVar9;
            }
          }
          if (((iVar7 != 2) && (1 < (ulong)nelem)) && (*repeat == 1)) {
            *incre = *rowlen;
            *repeat = nelem;
          }
          goto LAB_0013ae17;
        }
        snprintf(message,0x51,"First element to write is too large: %ld; max allowed value is %ld",
                 lVar11 + 1);
        goto LAB_0013a279;
      }
      *tcode = -*tcode;
      if (iVar7 != 0) {
        *repeat = nelem + *elemnum;
        pFVar8 = fptr->Fptr;
        if (firstrow <= pFVar8->numrows) {
          ffgdesll(fptr,colnum,firstrow,&lrepeat,&heapoffset,&tstatus);
          if (tstatus == 0) {
            iVar7 = *(int *)(ptVar1->ttype + lVar9 + -0x50);
            if (iVar7 < -0x52) {
              lrepeat = lrepeat * 2;
            }
            else if (iVar7 == -1) {
              lrepeat = (lrepeat + 7) / 8;
            }
            pFVar8 = fptr->Fptr;
            if (*repeat <= lrepeat) {
              *startpos = lVar11 + heapoffset + pFVar8->heapstart;
              lVar11 = *repeat;
              if (iVar7 < -0x52) {
                lVar11 = *repeat / 2;
              }
              ffpdes(fptr,colnum,firstrow,lVar11,heapoffset,status);
              return *status;
            }
          }
          else {
            pFVar8 = fptr->Fptr;
          }
        }
        lVar13 = pFVar8->numrows;
        nrows = firstrow - lVar13;
        if (nrows != 0 && lVar13 <= firstrow) {
          iVar7 = ffirow(fptr,lVar13,nrows,status);
          if (0 < iVar7) {
            snprintf(message,0x51,"Failed to add space for %.0f new rows in table.",(double)nrows);
            ffpmsg(message);
            return *status;
          }
          pFVar8 = fptr->Fptr;
        }
        *startpos = pFVar8->heapstart + lVar11 + pFVar8->heapsize;
        lVar13 = *repeat;
        if (*(int *)(ptVar1->ttype + lVar9 + -0x50) < -0x52) {
          lVar13 = *repeat / 2;
        }
        ffpdes(fptr,colnum,firstrow,lVar13,pFVar8->heapsize,status);
        pFVar8 = fptr->Fptr;
        lVar9 = *repeat;
        lVar13 = *incre;
        if (pFVar8->lasthdu == 0) {
          lVar11 = lVar13 * lVar9 + lVar11 + pFVar8->heapstart + pFVar8->heapsize;
          if (pFVar8->headstart[(long)pFVar8->curhdu + 1] < lVar11) {
            lVar11 = (lVar11 + ~pFVar8->headstart[(long)pFVar8->curhdu + 1]) / 0xb40 + 1;
            iVar7 = ffiblk(fptr,lVar11,1,status);
            if (0 < iVar7) {
              snprintf(message,0x51,
                       "Failed to extend the size of the variable length heap by %ld blocks.",lVar11
                      );
              ffpmsg(message);
              return *status;
            }
            lVar9 = *repeat;
            lVar13 = *incre;
            pFVar8 = fptr->Fptr;
          }
        }
        pFVar8->heapsize = pFVar8->heapsize + lVar13 * lVar9;
        goto LAB_0013ae17;
      }
      if (fptr->Fptr->numrows < firstrow) {
        ffpmsg("Attempt to read past end of table");
        snprintf(message,0x51,"  Table has %.0f rows and tried to read row %.0f.",
                 (double)fptr->Fptr->numrows,(double)firstrow);
LAB_0013a36e:
        ffpmsg(message);
        *status = 0x133;
        return 0x133;
      }
      ffgdesll(fptr,colnum,firstrow,&lrepeat,&heapoffset,status);
      *repeat = lrepeat;
      if (*(int *)(ptVar1->ttype + lVar9 + -0x50) < -0x52) {
        lrepeat = lrepeat * 2;
LAB_0013aa95:
        *repeat = lrepeat;
      }
      else if (*(int *)(ptVar1->ttype + lVar9 + -0x50) == -1) {
        lrepeat = (lrepeat + 7) / 8;
        goto LAB_0013aa95;
      }
      if (lrepeat <= *elemnum) {
        snprintf(message,0x51,"Starting element to read in variable length column is too large: %ld"
                 ,firstelem);
        ffpmsg(message);
        firstelem = *repeat;
        pcVar12 = "  This row only contains %ld elements";
        goto LAB_0013a272;
      }
      *startpos = lVar11 + heapoffset + fptr->Fptr->heapstart;
    }
    else if (*repeat < nelem + *elemnum) {
      *repeat = nelem + *elemnum;
    }
LAB_0013ae17:
    iVar7 = *status;
  }
  return iVar7;
}

Assistant:

int ffgcprll( fitsfile *fptr, /* I - FITS file pointer                      */
        int colnum,     /* I - column number (1 = 1st column of table)      */
        LONGLONG firstrow,  /* I - first row (1 = 1st row of table)         */
        LONGLONG firstelem, /* I - first element within vector (1 = 1st)    */
        LONGLONG nelem, /* I - number of elements to read or write          */
        int writemode,  /* I - = 1 if writing data, = 0 if reading data     */
                        /*     If = 2, then writing data, but don't modify  */
                        /*     the returned values of repeat and incre.     */
                        /*     If = -1, then reading data in reverse        */
                        /*     direction.                                   */
	                /*     If writemode has 16 added, then treat        */
	                /*        TSTRING column as TBYTE vector            */
        double *scale,  /* O - FITS scaling factor (TSCALn keyword value)   */
        double *zero,   /* O - FITS scaling zero pt (TZEROn keyword value)  */
        char *tform,    /* O - ASCII column format: value of TFORMn keyword */
        long *twidth,   /* O - width of ASCII column (characters)           */
        int *tcode,     /* O - abs(column datatype code): I*4=41, R*4=42, etc */
        int *maxelem,   /* O - max number of elements that fit in buffer    */
        LONGLONG *startpos,/* O - offset in file to starting row & column      */
        LONGLONG *elemnum, /* O - starting element number ( 0 = 1st element)   */
        long *incre,    /* O - byte offset between elements within a row    */
        LONGLONG *repeat,  /* O - number of elements in a row (vector column)  */
        LONGLONG *rowlen,  /* O - length of a row, in bytes                    */
        int  *hdutype,  /* O - HDU type: 0, 1, 2 = primary, table, bintable */
        LONGLONG *tnull,    /* O - null value for integer columns               */
        char *snull,    /* O - null value for ASCII table columns           */
        int *status)    /* IO - error status                                */
/*
  Get Column PaRameters, and test starting row and element numbers for 
  validity.  This is a workhorse routine that is call by nearly every
  other routine that reads or writes to FITS files.
*/
{
    int nulpos, rangecheck = 1, tstatus = 0;
    LONGLONG datastart, endpos;
    long nblock;
    LONGLONG heapoffset, lrepeat, endrow, nrows, tbcol;
    char message[FLEN_ERRMSG];
    tcolumn *colptr;

    if (fptr->HDUposition != (fptr->Fptr)->curhdu) {
        /* reset position to the correct HDU if necessary */
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    } else if ((fptr->Fptr)->datastart == DATA_UNDEFINED) {
        /* rescan header if data structure is undefined */
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    } else if (writemode > 0 && writemode != 15) {

	/* Only terminate the header with the END card if */
	/* writing to the stdout stream (don't have random access). */

	/* Initialize STREAM_DRIVER to be the device number for */
	/* writing FITS files directly out to the stdout stream. */
	/* This only needs to be done once and is thread safe. */
	if (STREAM_DRIVER <= 0 || STREAM_DRIVER > 40) {
            urltype2driver("stream://", &STREAM_DRIVER);
        }

        if ((fptr->Fptr)->driver == STREAM_DRIVER) {
	    if ((fptr->Fptr)->ENDpos != 
	       maxvalue((fptr->Fptr)->headend , (fptr->Fptr)->datastart -2880)) {
	           ffwend(fptr, status);
	    } 
	}
    }

    /* Do sanity check of input parameters */
    if (firstrow < 1)
    {
        if ((fptr->Fptr)->hdutype == IMAGE_HDU) /*  Primary Array or IMAGE */
        {
          snprintf(message,FLEN_ERRMSG, "Image group number is less than 1: %.0f",
                (double) firstrow);
          ffpmsg(message);
          return(*status = BAD_ROW_NUM);
        }
        else
        {
          snprintf(message, FLEN_ERRMSG,"Starting row number is less than 1: %.0f",
                (double) firstrow);
          ffpmsg(message);
          return(*status = BAD_ROW_NUM);
        }
    }
    else if ((fptr->Fptr)->hdutype != ASCII_TBL && firstelem < 1)
    {
        snprintf(message, FLEN_ERRMSG,"Starting element number less than 1: %ld",
               (long) firstelem);
        ffpmsg(message);
        return(*status = BAD_ELEM_NUM);
    }
    else if (nelem < 0)
    {
        snprintf(message, FLEN_ERRMSG,"Tried to read or write less than 0 elements: %.0f",
            (double) nelem);
        ffpmsg(message);
        return(*status = NEG_BYTES);
    }
    else if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        snprintf(message, FLEN_ERRMSG,"  There are %d columns in this table.",
                (fptr->Fptr)->tfield );
        ffpmsg(message);

        return(*status = BAD_COL_NUM);
    }

    /*  copy relevant parameters from the structure */

    *hdutype = (fptr->Fptr)->hdutype;    /* image, ASCII table, or BINTABLE  */
    *rowlen   = (fptr->Fptr)->rowlength; /* width of the table, in bytes     */
    datastart = (fptr->Fptr)->datastart; /* offset in file to start of table */

    colptr  = (fptr->Fptr)->tableptr;    /* point to first column */
    colptr += (colnum - 1);      /* offset to correct column structure */

    *scale    = colptr->tscale;  /* value scaling factor;    default = 1.0 */
    *zero     = colptr->tzero;   /* value scaling zeropoint; default = 0.0 */
    *tnull    = colptr->tnull;   /* null value for integer columns         */
    tbcol     = colptr->tbcol;   /* offset to start of column within row   */
    *twidth   = colptr->twidth;  /* width of a single datum, in bytes      */
    *incre    = colptr->twidth;  /* increment between datums, in bytes     */

    *tcode    = colptr->tdatatype;
    *repeat   = colptr->trepeat;

    strcpy(tform, colptr->tform);    /* value of TFORMn keyword            */
    strcpy(snull, colptr->strnull);  /* null value for ASCII table columns */

    if (*hdutype == ASCII_TBL && snull[0] == '\0')
    {
     /* In ASCII tables, a null value is equivalent to all spaces */

       strcpy(snull, "                 ");   /* maximum of 17 spaces */
       nulpos = minvalue(17, *twidth);      /* truncate to width of column */
       snull[nulpos] = '\0';
    }

    /* Special case: use writemode = 15,16,17,18 to interpret TSTRING columns
       as TBYTE vectors instead (but not for ASCII tables). 
          writemode = 15 equivalent to writemode =-1
          writemode = 16 equivalent to writemode = 0
          writemode = 17 equivalent to writemode = 1
          writemode = 18 equivalent to writemode = 2
    */
    if (writemode >= 15 && writemode <= 18) {

      if (abs(*tcode) == TSTRING && *hdutype != ASCII_TBL ) {
        *incre = 1;          /* each element is 1 byte wide */
	if (*tcode < 0) *repeat = *twidth;  /* variable columns appear to put width in *twidth */
        *twidth = 1;         /* width of each element */
        *scale = 1.0;        /* no scaling */
        *zero  = 0.0;
        *tnull = NULL_UNDEFINED;  /* don't test for nulls */
        *maxelem = DBUFFSIZE;

	if (*tcode < 0) {
	  *tcode = -TBYTE; /* variable-length */
	} else {
	  *tcode =  TBYTE;
	}
      }

      /* translate to the equivalent as listed above */
      writemode -= 16;
    }

    /* Special case:  interpret writemode = -1 as reading data, but */
    /* don't do error check for exceeding the range of pixels  */
    if (writemode == -1)
    {
      writemode = 0;
      rangecheck = 0;
    }

    /* Special case: interprete 'X' column as 'B' */
    if (abs(*tcode) == TBIT)
    {
        *tcode  = *tcode / TBIT * TBYTE;
        *repeat = (*repeat + 7) / 8;
    }

    /* Special case: support the 'rAw' format in BINTABLEs */
    if (*hdutype == BINARY_TBL && *tcode == TSTRING) {
       if (*twidth)
          *repeat = *repeat / *twidth;  /* repeat = # of unit strings in field */
       else
          *repeat = 0;
    }
    else if (*hdutype == BINARY_TBL && *tcode == -TSTRING) {
       /* variable length string */
       *incre = 1;
       *twidth = (long) nelem;
    }

    if (*hdutype == ASCII_TBL)
        *elemnum = 0;   /* ASCII tables don't have vector elements */
    else
        *elemnum = firstelem - 1;

    /* interprete complex and double complex as pairs of floats or doubles */
    if (abs(*tcode) >= TCOMPLEX)
    {
        if (*tcode > 0)
          *tcode = (*tcode + 1) / 2;
        else
          *tcode = (*tcode - 1) / 2;

        *repeat  = *repeat * 2;
        *twidth  = *twidth / 2;
        *incre   = *incre  / 2;
    }

    /* calculate no. of pixels that fit in buffer */
    /* allow for case where floats are 8 bytes long */
    if (abs(*tcode) == TFLOAT)
       *maxelem = DBUFFSIZE / sizeof(float);
    else if (abs(*tcode) == TDOUBLE)
       *maxelem = DBUFFSIZE / sizeof(double);
    else if (abs(*tcode) == TSTRING)
    {
       if (*twidth)
          *maxelem = (DBUFFSIZE - 1)/ *twidth; /* leave room for final \0 */
       else
          *maxelem = DBUFFSIZE - 1;
          
       if (*maxelem == 0) {
            snprintf(message,FLEN_ERRMSG,
        "ASCII string column is too wide: %ld; max supported width is %d",
                   *twidth,  DBUFFSIZE - 1);
            ffpmsg(message);
            return(*status = COL_TOO_WIDE);
        }
    }
    else
       *maxelem = DBUFFSIZE / *twidth; 

    /* calc starting byte position to 1st element of col  */
    /*  (this does not apply to variable length columns)  */
    *startpos = datastart + ((LONGLONG)(firstrow - 1) * *rowlen) + tbcol;

    if (*hdutype == IMAGE_HDU && writemode) /*  Primary Array or IMAGE */
    { /*
        For primary arrays, set the repeat count greater than the total
        number of pixels to be written.  This prevents an out-of-range
        error message in cases where the final image array size is not
        yet known or defined.
      */
        if (*repeat < *elemnum + nelem)
            *repeat = *elemnum + nelem; 
    }
    else if (*tcode > 0)     /*  Fixed length table column  */
    {
        if (*elemnum >= *repeat)
        {
            snprintf(message,FLEN_ERRMSG,
        "First element to write is too large: %ld; max allowed value is %ld",
                   (long) ((*elemnum) + 1), (long) *repeat);
            ffpmsg(message);
            return(*status = BAD_ELEM_NUM);
        }

        /* last row number to be read or written */
        endrow = ((*elemnum + nelem - 1) / *repeat) + firstrow;

        if (writemode)
        {
            /* check if we are writing beyond the current end of table */
            if ((endrow > (fptr->Fptr)->numrows) && (nelem > 0) )
            {
                /* if there are more HDUs following the current one, or */
                /* if there is a data heap, then we must insert space */
                /* for the new rows.  */
                if ( !((fptr->Fptr)->lasthdu) || (fptr->Fptr)->heapsize > 0)
                {
                    nrows = endrow - ((fptr->Fptr)->numrows);
                    if (ffirow(fptr, (fptr->Fptr)->numrows, nrows, status) > 0)
                    {
                       snprintf(message,FLEN_ERRMSG,
                       "Failed to add space for %.0f new rows in table.",
                       (double) nrows);
                       ffpmsg(message);
                       return(*status);
                    }
                }
                else
                {
                  /* update heap starting address */
                  (fptr->Fptr)->heapstart += 
                  ((LONGLONG)(endrow - (fptr->Fptr)->numrows) * 
                          (fptr->Fptr)->rowlength );

                  (fptr->Fptr)->numrows = endrow; /* update number of rows */
                }
            }
        }
        else  /* reading from the file */
        {
          if ( endrow > (fptr->Fptr)->numrows && rangecheck)
          {
            if (*hdutype == IMAGE_HDU) /*  Primary Array or IMAGE */
            {
              if (firstrow > (fptr->Fptr)->numrows)
              {
                snprintf(message, FLEN_ERRMSG,
                  "Attempted to read from group %ld of the HDU,", (long) firstrow);
                ffpmsg(message);

                snprintf(message, FLEN_ERRMSG,
                  "however the HDU only contains %ld group(s).",
                   (long) ((fptr->Fptr)->numrows) );
                ffpmsg(message);
              }
              else
              {
                ffpmsg("Attempt to read past end of array:");
                snprintf(message, FLEN_ERRMSG,
                  "  Image has  %ld elements;", (long) *repeat);
                ffpmsg(message);

                snprintf(message, FLEN_ERRMSG, 
                "  Tried to read %ld elements starting at element %ld.",
                (long) nelem, (long) firstelem);
                ffpmsg(message);
              }
            }
            else
            {
              ffpmsg("Attempt to read past end of table:");
              snprintf(message, FLEN_ERRMSG,
                "  Table has %.0f rows with %.0f elements per row;",
                    (double) ((fptr->Fptr)->numrows), (double) *repeat);
              ffpmsg(message);

              snprintf(message, FLEN_ERRMSG,
              "  Tried to read %.0f elements starting at row %.0f, element %.0f.",
              (double) nelem, (double) firstrow, (double) ((*elemnum) + 1));
              ffpmsg(message);

            }
            return(*status = BAD_ROW_NUM);
          }
        }

        if (*repeat == 1 && nelem > 1 && writemode != 2)
        { /*
            When accessing a scalar column, fool the calling routine into
            thinking that this is a vector column with very big elements.
            This allows multiple values (up to the maxelem number of elements
            that will fit in the buffer) to be read or written with a single
            routine call, which increases the efficiency.

            If writemode == 2, then the calling program does not want to
            have this efficiency trick applied.
          */           
            if (*rowlen <= LONG_MAX) {
                *incre = (long) *rowlen;
                *repeat = nelem;
            }
        }
    }
    else    /*  Variable length Binary Table column */
    {
      *tcode *= (-1);  

      if (writemode)    /* return next empty heap address for writing */
      {

        *repeat = nelem + *elemnum; /* total no. of elements in the field */

        /* first, check if we are overwriting an existing row, and */
        /* if so, if the existing space is big enough for the new vector */

        if ( firstrow <= (fptr->Fptr)->numrows )
        {
          ffgdesll(fptr, colnum, firstrow, &lrepeat, &heapoffset, &tstatus);
          if (!tstatus)
          {
            if (colptr->tdatatype <= -TCOMPLEX)
              lrepeat = lrepeat * 2;  /* no. of float or double values */
            else if (colptr->tdatatype == -TBIT)
              lrepeat = (lrepeat + 7) / 8;  /* convert from bits to bytes */

            if (lrepeat >= *repeat)  /* enough existing space? */
            {
              *startpos = datastart + heapoffset + (fptr->Fptr)->heapstart;

              /*  write the descriptor into the fixed length part of table */
              if (colptr->tdatatype <= -TCOMPLEX)
              {
                /* divide repeat count by 2 to get no. of complex values */
                ffpdes(fptr, colnum, firstrow, *repeat / 2, 
                      heapoffset, status);
              }
              else
              {
                ffpdes(fptr, colnum, firstrow, *repeat,
                      heapoffset, status);
              }
              return(*status);
            }
          }
        }

        /* Add more rows to the table, if writing beyond the end. */
        /* It is necessary to shift the heap down in this case */
        if ( firstrow > (fptr->Fptr)->numrows)
        {
            nrows = firstrow - ((fptr->Fptr)->numrows);
            if (ffirow(fptr, (fptr->Fptr)->numrows, nrows, status) > 0)
            {
                snprintf(message,FLEN_ERRMSG,
                "Failed to add space for %.0f new rows in table.",
                       (double) nrows);
                ffpmsg(message);
                return(*status);
            }
        }

        /*  calculate starting position (for writing new data) in the heap */
        *startpos = datastart + (fptr->Fptr)->heapstart + 
                    (fptr->Fptr)->heapsize;

        /*  write the descriptor into the fixed length part of table */
        if (colptr->tdatatype <= -TCOMPLEX)
        {
          /* divide repeat count by 2 to get no. of complex values */
          ffpdes(fptr, colnum, firstrow, *repeat / 2, 
                (fptr->Fptr)->heapsize, status);
        }
        else
        {
          ffpdes(fptr, colnum, firstrow, *repeat, (fptr->Fptr)->heapsize,
                 status);
        }

        /* If this is not the last HDU in the file, then check if */
        /* extending the heap would overwrite the following header. */
        /* If so, then have to insert more blocks. */
        if ( !((fptr->Fptr)->lasthdu) )
        {
            endpos = datastart + (fptr->Fptr)->heapstart + 
                     (fptr->Fptr)->heapsize + ( *repeat * (*incre));

            if (endpos > (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1])
            {
                /* calc the number of blocks that need to be added */
                nblock = (long) (((endpos - 1 - 
                         (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] ) 
                         / 2880) + 1);

                if (ffiblk(fptr, nblock, 1, status) > 0) /* insert blocks */
                {
                  snprintf(message,FLEN_ERRMSG,
       "Failed to extend the size of the variable length heap by %ld blocks.",
                   nblock);
                   ffpmsg(message);
                   return(*status);
                }
            }
        }

        /* increment the address to the next empty heap position */
        (fptr->Fptr)->heapsize += ( *repeat * (*incre)); 
      }
      else    /*  get the read start position in the heap */
      {
        if ( firstrow > (fptr->Fptr)->numrows)
        {
            ffpmsg("Attempt to read past end of table");
            snprintf(message,FLEN_ERRMSG, 
                "  Table has %.0f rows and tried to read row %.0f.",
                (double) ((fptr->Fptr)->numrows), (double) firstrow);
            ffpmsg(message);
            return(*status = BAD_ROW_NUM);
        }

        ffgdesll(fptr, colnum, firstrow, &lrepeat, &heapoffset, status);
        *repeat = lrepeat;

        if (colptr->tdatatype <= -TCOMPLEX)
            *repeat = *repeat * 2;  /* no. of float or double values */
        else if (colptr->tdatatype == -TBIT)
            *repeat = (*repeat + 7) / 8;  /* convert from bits to bytes */

        if (*elemnum >= *repeat)
        {
            snprintf(message,FLEN_ERRMSG, 
         "Starting element to read in variable length column is too large: %ld",
                    (long) firstelem);
            ffpmsg(message);
            snprintf(message,FLEN_ERRMSG, 
         "  This row only contains %ld elements", (long) *repeat);
            ffpmsg(message);
            return(*status = BAD_ELEM_NUM);
        }

        *startpos = datastart + heapoffset + (fptr->Fptr)->heapstart;
      }
    }
    return(*status);
}